

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidatePtrComparison(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  AddressingModel AVar3;
  uint32_t uVar4;
  Op OVar5;
  uint uVar6;
  uint32_t uVar7;
  Feature *pFVar8;
  DiagnosticStream *pDVar9;
  bool local_14d5;
  DiagnosticStream local_14a8;
  DiagnosticStream local_12d0;
  DiagnosticStream local_10f8;
  StorageClass local_f1c;
  undefined1 local_f18 [4];
  StorageClass sc;
  DiagnosticStream local_d40;
  StorageClass local_b64;
  StorageClass local_b60;
  StorageClass sc2;
  StorageClass sc1;
  bool either_untyped;
  DiagnosticStream local_980;
  DiagnosticStream local_7a8;
  Instruction *local_5d0;
  Instruction *op2_type;
  Instruction *op1_type;
  Instruction *op2;
  Instruction *op1;
  DiagnosticStream local_3d8;
  Instruction *local_200;
  Instruction *result_type;
  Instruction *local_20;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_20 = (Instruction *)inst;
  inst_local = (Instruction *)_;
  AVar3 = ValidationState_t::addressing_model(_);
  if ((AVar3 == AddressingModelLogical) &&
     (pFVar8 = ValidationState_t::features((ValidationState_t *)inst_local),
     (pFVar8->variable_pointers & 1U) == 0)) {
    ValidationState_t::diag
              ((DiagnosticStream *)&result_type,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID
               ,local_20);
    pDVar9 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&result_type,
                        (char (*) [95])
                        "Instruction cannot for logical addressing model be used without a variable pointers capability"
                       );
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&result_type);
  }
  else {
    pIVar1 = inst_local;
    uVar4 = val::Instruction::type_id(local_20);
    local_200 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar4);
    OVar5 = val::Instruction::opcode(local_20);
    if (OVar5 == OpPtrDiff) {
      if ((local_200 == (Instruction *)0x0) ||
         (OVar5 = val::Instruction::opcode(local_200), OVar5 != OpTypeInt)) {
        ValidationState_t::diag
                  (&local_3d8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
        pDVar9 = DiagnosticStream::operator<<
                           (&local_3d8,(char (*) [38])"Result Type must be an integer scalar");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        DiagnosticStream::~DiagnosticStream(&local_3d8);
        return __local._4_4_;
      }
    }
    else if ((local_200 == (Instruction *)0x0) ||
            (OVar5 = val::Instruction::opcode(local_200), OVar5 != OpTypeBool)) {
      ValidationState_t::diag
                ((DiagnosticStream *)&op1,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 local_20);
      pDVar9 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&op1,(char (*) [31])"Result Type must be OpTypeBool");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&op1);
      return __local._4_4_;
    }
    pIVar1 = inst_local;
    uVar6 = val::Instruction::GetOperandAs<unsigned_int>(local_20,2);
    op2 = (Instruction *)ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar6);
    pIVar1 = inst_local;
    uVar6 = val::Instruction::GetOperandAs<unsigned_int>(local_20,3);
    op1_type = (Instruction *)ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar6);
    pIVar1 = inst_local;
    uVar4 = val::Instruction::type_id((Instruction *)op2);
    op2_type = (Instruction *)ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar4);
    pIVar1 = inst_local;
    uVar4 = val::Instruction::type_id((Instruction *)op1_type);
    local_5d0 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar4);
    if ((op2_type == (Instruction *)0x0) ||
       ((OVar5 = val::Instruction::opcode((Instruction *)op2_type), OVar5 != OpTypePointer &&
        (OVar5 = val::Instruction::opcode((Instruction *)op2_type), OVar5 != OpTypeUntypedPointerKHR
        )))) {
      ValidationState_t::diag
                (&local_7a8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
      pDVar9 = DiagnosticStream::operator<<
                         (&local_7a8,(char (*) [31])"Operand type must be a pointer");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
      DiagnosticStream::~DiagnosticStream(&local_7a8);
    }
    else if ((local_5d0 == (Instruction *)0x0) ||
            ((OVar5 = val::Instruction::opcode(local_5d0), OVar5 != OpTypePointer &&
             (OVar5 = val::Instruction::opcode(local_5d0), OVar5 != OpTypeUntypedPointerKHR)))) {
      ValidationState_t::diag
                (&local_980,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
      pDVar9 = DiagnosticStream::operator<<
                         (&local_980,(char (*) [31])"Operand type must be a pointer");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
      DiagnosticStream::~DiagnosticStream(&local_980);
    }
    else {
      OVar5 = val::Instruction::opcode(local_20);
      if (OVar5 == OpPtrDiff) {
        uVar4 = val::Instruction::type_id((Instruction *)op2);
        uVar7 = val::Instruction::type_id((Instruction *)op1_type);
        if (uVar4 != uVar7) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&sc1,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                     local_20);
          pDVar9 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)&sc1,
                              (char (*) [48])"The types of Operand 1 and Operand 2 must match");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&sc1);
          return __local._4_4_;
        }
      }
      else {
        OVar5 = val::Instruction::opcode((Instruction *)op2_type);
        local_14d5 = true;
        if (OVar5 != OpTypeUntypedPointerKHR) {
          OVar5 = val::Instruction::opcode(local_5d0);
          local_14d5 = OVar5 == OpTypeUntypedPointerKHR;
        }
        sc2._3_1_ = local_14d5;
        if (local_14d5 == false) {
          uVar4 = val::Instruction::type_id((Instruction *)op2);
          uVar7 = val::Instruction::type_id((Instruction *)op1_type);
          if (uVar4 != uVar7) {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_f18,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_ID,local_20);
            pDVar9 = DiagnosticStream::operator<<
                               ((DiagnosticStream *)local_f18,
                                (char (*) [48])"The types of Operand 1 and Operand 2 must match");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_f18);
            return __local._4_4_;
          }
        }
        else {
          local_b60 = val::Instruction::GetOperandAs<spv::StorageClass>((Instruction *)op2_type,1);
          local_b64 = val::Instruction::GetOperandAs<spv::StorageClass>(local_5d0,1);
          if (local_b60 != local_b64) {
            ValidationState_t::diag
                      (&local_d40,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
            pDVar9 = DiagnosticStream::operator<<
                               (&local_d40,(char (*) [35])"Pointer storage classes must match");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
            DiagnosticStream::~DiagnosticStream(&local_d40);
            return __local._4_4_;
          }
        }
      }
      local_f1c = val::Instruction::GetOperandAs<spv::StorageClass>((Instruction *)op2_type,1);
      AVar3 = ValidationState_t::addressing_model((ValidationState_t *)inst_local);
      if (AVar3 == AddressingModelLogical) {
        if ((local_f1c != StorageClassWorkgroup) && (local_f1c != StorageBuffer)) {
          ValidationState_t::diag
                    (&local_10f8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
          pDVar9 = DiagnosticStream::operator<<
                             (&local_10f8,(char (*) [30])"Invalid pointer storage class");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          DiagnosticStream::~DiagnosticStream(&local_10f8);
          return __local._4_4_;
        }
        if ((local_f1c == StorageClassWorkgroup) &&
           (bVar2 = ValidationState_t::HasCapability
                              ((ValidationState_t *)inst_local,CapabilityVariablePointers), !bVar2))
        {
          ValidationState_t::diag
                    (&local_12d0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
          pDVar9 = DiagnosticStream::operator<<
                             (&local_12d0,
                              (char (*) [85])
                              "Workgroup storage class pointer requires VariablePointers capability to be specified"
                             );
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          DiagnosticStream::~DiagnosticStream(&local_12d0);
          return __local._4_4_;
        }
      }
      else if (local_f1c == PhysicalStorageBuffer) {
        ValidationState_t::diag
                  (&local_14a8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
        pDVar9 = DiagnosticStream::operator<<
                           (&local_14a8,
                            (char (*) [64])
                            "Cannot use a pointer in the PhysicalStorageBuffer storage class");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        DiagnosticStream::~DiagnosticStream(&local_14a8);
        return __local._4_4_;
      }
      __local._4_4_ = SPV_SUCCESS;
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidatePtrComparison(ValidationState_t& _,
                                   const Instruction* inst) {
  if (_.addressing_model() == spv::AddressingModel::Logical &&
      !_.features().variable_pointers) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Instruction cannot for logical addressing model be used without "
              "a variable pointers capability";
  }

  const auto result_type = _.FindDef(inst->type_id());
  if (inst->opcode() == spv::Op::OpPtrDiff) {
    if (!result_type || result_type->opcode() != spv::Op::OpTypeInt) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Result Type must be an integer scalar";
    }
  } else {
    if (!result_type || result_type->opcode() != spv::Op::OpTypeBool) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Result Type must be OpTypeBool";
    }
  }

  const auto op1 = _.FindDef(inst->GetOperandAs<uint32_t>(2u));
  const auto op2 = _.FindDef(inst->GetOperandAs<uint32_t>(3u));
  const auto op1_type = _.FindDef(op1->type_id());
  const auto op2_type = _.FindDef(op2->type_id());
  if (!op1_type || (op1_type->opcode() != spv::Op::OpTypePointer &&
                    op1_type->opcode() != spv::Op::OpTypeUntypedPointerKHR)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Operand type must be a pointer";
  }

  if (!op2_type || (op2_type->opcode() != spv::Op::OpTypePointer &&
                    op2_type->opcode() != spv::Op::OpTypeUntypedPointerKHR)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Operand type must be a pointer";
  }

  if (inst->opcode() == spv::Op::OpPtrDiff) {
    if (op1->type_id() != op2->type_id()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "The types of Operand 1 and Operand 2 must match";
    }
  } else {
    const auto either_untyped =
        op1_type->opcode() == spv::Op::OpTypeUntypedPointerKHR ||
        op2_type->opcode() == spv::Op::OpTypeUntypedPointerKHR;
    if (either_untyped) {
      const auto sc1 = op1_type->GetOperandAs<spv::StorageClass>(1);
      const auto sc2 = op2_type->GetOperandAs<spv::StorageClass>(1);
      if (sc1 != sc2) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << "Pointer storage classes must match";
      }
    } else if (op1->type_id() != op2->type_id()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "The types of Operand 1 and Operand 2 must match";
    }
  }

  spv::StorageClass sc = op1_type->GetOperandAs<spv::StorageClass>(1u);
  if (_.addressing_model() == spv::AddressingModel::Logical) {
    if (sc != spv::StorageClass::Workgroup &&
        sc != spv::StorageClass::StorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Invalid pointer storage class";
    }

    if (sc == spv::StorageClass::Workgroup &&
        !_.HasCapability(spv::Capability::VariablePointers)) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Workgroup storage class pointer requires VariablePointers "
                "capability to be specified";
    }
  } else if (sc == spv::StorageClass::PhysicalStorageBuffer) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Cannot use a pointer in the PhysicalStorageBuffer storage class";
  }

  return SPV_SUCCESS;
}